

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33ab2::
ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_DbInsertNodeRecursion_Test
          (ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, DbInsertNodeRecursion) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(3, unodb::test::test_values[2]);
  // Insert a value that does not share full prefix with the current Node4
  verifier.insert(0xFF0001, unodb::test::test_values[3]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_growing_inodes({2, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS

  // Then insert a value that shares full prefix with the above node and will
  // ask for a recursive insertion there
  verifier.insert(0xFF0101, unodb::test::test_values[1]);

  verifier.check_present_values();
  verifier.check_absent_keys({0xFF0100, 0xFF0000, 2});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({4, 3, 0, 0, 0});
  verifier.assert_growing_inodes({3, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
}